

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::MergeFrom
          (CodeGeneratorResponse *this,CodeGeneratorResponse *from)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  LogMessage *other;
  undefined8 *puVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x5eb);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::TypeHandler>
            (&(this->file_).super_RepeatedPtrFieldBase,&(from->file_).super_RepeatedPtrFieldBase);
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      pvVar2 = (from->error_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      puVar4 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar4 = (undefined8 *)*puVar4;
      }
      internal::ArenaStringPtr::Set(&this->error_,(ulong)pvVar2 & 0xfffffffffffffffe,puVar4);
    }
    if ((uVar1 & 2) != 0) {
      this->supported_features_ = from->supported_features_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar1;
  }
  uVar3 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_,
               (UnknownFieldSet *)((uVar3 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void CodeGeneratorResponse::MergeFrom(const CodeGeneratorResponse& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.CodeGeneratorResponse)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  file_.MergeFrom(from.file_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_error(from._internal_error());
    }
    if (cached_has_bits & 0x00000002u) {
      supported_features_ = from.supported_features_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
}